

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::outputStyleAscii(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uchar outputWord [256];
  char local_151;
  ostream *local_150;
  ulong local_148;
  Binasc *local_140;
  byte local_138 [264];
  
  uVar12 = 0;
  local_140 = this;
  memset(local_138,0,0x100);
  bVar5 = std::istream::get();
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    bVar3 = false;
    local_148 = 0;
    local_150 = out;
    do {
      iVar6 = isprint((uint)bVar5);
      bVar4 = false;
      if (iVar6 != 0) {
        iVar7 = isspace((uint)bVar5);
        iVar6 = (int)uVar12;
        if (bVar3 || iVar7 != 0) {
          if (iVar7 != 0) goto LAB_0011b308;
        }
        else {
          iVar1 = (int)local_148;
          iVar10 = local_140->m_maxLineLength;
          local_138[iVar6] = 0;
          if (iVar6 + iVar1 < iVar10) {
            iVar10 = 0;
            if (iVar1 != 0) {
              local_151 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(local_150,&local_151,1);
              iVar10 = iVar1 + 1;
            }
            sVar8 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(local_150,(char *)local_138,sVar8);
            uVar11 = iVar10 + iVar6;
            iVar6 = 0;
            local_148 = (ulong)uVar11;
          }
          else {
            local_151 = '\n';
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>(local_150,&local_151,1);
            sVar8 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_138,sVar8);
            iVar6 = 0;
            local_148 = uVar12;
          }
        }
        local_138[iVar6] = bVar5;
        uVar12 = (ulong)(iVar6 + 1);
        bVar4 = iVar7 == 0;
      }
LAB_0011b308:
      bVar3 = bVar4;
      bVar5 = std::istream::get();
    } while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0);
    if ((int)uVar12 != 0) {
      cVar2 = (char)local_150;
      std::ios::widen((char)*(undefined8 *)(*(long *)local_150 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
  }
  return 1;
}

Assistant:

int Binasc::outputStyleAscii(std::ostream& out, std::istream& input) {
	uchar outputWord[256] = {0};   // storage for current word
	int index     = 0;             // current length of word
	int lineCount = 0;             // current length of line
	int type      = 0;             // 0=space, 1=printable
	uchar ch;                      // current input byte

	ch = input.get();
	while (!input.eof()) {
		int lastType = type;
		type = (isprint(ch) && !isspace(ch)) ? 1 : 0;

		if ((type == 1) && (lastType == 0)) {
			// start of a new word.  check where to put old word
			if (index + lineCount >= m_maxLineLength) {  // put on next line
				outputWord[index] = '\0';
				out << '\n' << outputWord;
				lineCount = index;
				index = 0;
			} else {                                   // put on current line
				outputWord[index] = '\0';
				if (lineCount != 0) {
					out << ' ';
					lineCount++;
				}
				out << outputWord;
				lineCount += index;
				index = 0;
			}
		}
		if (type == 1) {
			outputWord[index++] = ch;
		}
		ch = input.get();
	}

	if (index != 0) {
		out << std::endl;
	}

	return 1;
}